

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

QLatin1StringView __thiscall QHttpHeaders::nameAt(QHttpHeaders *this,qsizetype i)

{
  long lVar1;
  QLatin1StringView QVar2;
  long in_FS_OFFSET;
  QByteArrayView s;
  qsizetype in_stack_ffffffffffffff98;
  HeaderName *in_stack_ffffffffffffffa0;
  QLatin1String *in_stack_ffffffffffffffa8;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c80d2);
  QList<Header>::at((QList<Header> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  s = HeaderName::asView(in_stack_ffffffffffffffa0);
  QLatin1String::QLatin1String(in_stack_ffffffffffffffa8,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2.m_data = local_10;
    QVar2.m_size = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

const noexcept
{
    verify(i);
    return QLatin1StringView{d->headers.at(i).name.asView()};
}